

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-file.c
# Opt level: O1

void file_get_savefile(char *filename,size_t max,char *base,char *ext)

{
  uint32_t uVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  stat local_c0;
  
  uVar1 = Rand_simple(1000000);
  strnfmt(filename,max,"%s%lu.%s",base,(ulong)uVar1,ext);
  iVar2 = stat(filename,&local_c0);
  if (iVar2 == 0) {
    uVar3 = 0;
    do {
      uVar1 = Rand_simple(1000000);
      strnfmt(filename,max,"%s%lu%u.%s",base,(ulong)uVar1,(ulong)(uVar3 + 1),ext);
      iVar2 = stat(filename,&local_c0);
      if (iVar2 != 0) {
        return;
      }
      bVar4 = uVar3 < 99;
      uVar3 = uVar3 + 1;
    } while (bVar4);
  }
  return;
}

Assistant:

void file_get_savefile(char *filename, size_t max, const char *base,
	const char *ext)
{
	int count = 0;

	count = 0;

#ifdef DJGPP
	/* DOS needs a shorter file name */
	strnfmt(filename, max, "%s/temp.%s", dirname(base), ext);
	while (file_exists(filename) && (count++ < 100))
		strnfmt(filename, max, "%s/temp%u.%s", dirname(base), count,
			ext);
#else
	strnfmt(filename, max, "%s%lu.%s",
		base, (unsigned long)Rand_simple(1000000), ext);
	while (file_exists(filename) && (count++ < 100))
		strnfmt(filename, max, "%s%lu%u.%s",
			base, (unsigned long)Rand_simple(1000000), count, ext);
#endif /* ! DJGPP */
	return;
}